

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O3

int point_mul_g_id_tc26_gost_3410_2012_256_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint64_t x2;
  BIGNUM *pBVar8;
  BIGNUM *pBVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  pt_aff_t_conflict1 (*papVar15) [16];
  long in_R8;
  long in_R9;
  long in_R10;
  long in_R11;
  pt_aff_t_conflict1 *arg3;
  BIGNUM *pBVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uchar b_n [32];
  uchar b_x [32];
  int8_t rnaf [52];
  uchar b_y [32];
  long local_308;
  long lStack_300;
  uint64_t local_2e0;
  long local_2d8;
  undefined1 local_2c8 [24];
  undefined8 uStack_2b0;
  ulong local_2a8;
  uint64_t auStack_2a0 [5];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_258;
  byte local_248 [32];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  uint64_t local_208;
  limb_t lStack_200;
  limb_t lStack_1f8;
  limb_t lStack_1f0;
  undefined1 auStack_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  uint64_t local_1b8;
  limb_t lStack_1b0;
  limb_t lStack_1a8;
  limb_t lStack_1a0;
  undefined1 auStack_198 [16];
  int8_t local_188 [64];
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  uint64_t local_a8;
  long local_a0;
  undefined8 local_98;
  long local_90;
  BIGNUM *local_88;
  uint64_t local_80 [5];
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  pBVar9 = BN_CTX_get((BN_CTX *)ctx);
  auVar23._8_8_ = 0;
  iVar14 = 0;
  if ((pBVar9 != (BIGNUM *)0x0) && (iVar7 = BN_bn2lebinpad(n,local_248,0x20), iVar7 == 0x20)) {
    local_188[0x20] = '\0';
    local_188[0x21] = '\0';
    local_188[0x22] = '\0';
    local_188[0x23] = '\0';
    local_188[0x24] = '\0';
    local_188[0x25] = '\0';
    local_188[0x26] = '\0';
    local_188[0x27] = '\0';
    local_188[0x28] = '\0';
    local_188[0x29] = '\0';
    local_188[0x2a] = '\0';
    local_188[0x2b] = '\0';
    local_188[0x2c] = '\0';
    local_188[0x2d] = '\0';
    local_188[0x2e] = '\0';
    local_188[0x2f] = '\0';
    local_188[0x10] = '\0';
    local_188[0x11] = '\0';
    local_188[0x12] = '\0';
    local_188[0x13] = '\0';
    local_188[0x14] = '\0';
    local_188[0x15] = '\0';
    local_188[0x16] = '\0';
    local_188[0x17] = '\0';
    local_188[0x18] = '\0';
    local_188[0x19] = '\0';
    local_188[0x1a] = '\0';
    local_188[0x1b] = '\0';
    local_188[0x1c] = '\0';
    local_188[0x1d] = '\0';
    local_188[0x1e] = '\0';
    local_188[0x1f] = '\0';
    local_188[0] = '\0';
    local_188[1] = '\0';
    local_188[2] = '\0';
    local_188[3] = '\0';
    local_188[4] = '\0';
    local_188[5] = '\0';
    local_188[6] = '\0';
    local_188[7] = '\0';
    local_188[8] = '\0';
    local_188[9] = '\0';
    local_188[10] = '\0';
    local_188[0xb] = '\0';
    local_188[0xc] = '\0';
    local_188[0xd] = '\0';
    local_188[0xe] = '\0';
    local_188[0xf] = '\0';
    local_188[0x30] = '\0';
    local_188[0x31] = '\0';
    local_188[0x32] = '\0';
    local_188[0x33] = '\0';
    uVar13 = 0;
    memset(local_148,0,0xa0);
    local_258 = 0;
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    auStack_2a0[3] = 0;
    auStack_2a0[4] = 0;
    auStack_2a0[1] = 0;
    auStack_2a0[2] = 0;
    local_2a8 = 0;
    auStack_2a0[0] = 0;
    stack0xfffffffffffffd48 = ZEXT816(0);
    local_2c8._0_16_ = ZEXT816(0);
    scalar_rwnaf(local_188,local_248);
    local_208 = 0;
    local_218 = (undefined1  [16])0x0;
    local_228 = (undefined1  [16])0x0;
    lStack_200 = const_one[0];
    lStack_1f8 = const_one[1];
    lStack_1f0 = 0;
    auStack_1e8 = ZEXT816(0);
    local_1d8 = (undefined1  [16])0x0;
    local_1c8 = (undefined1  [16])0x0;
    local_1b8 = 0;
    lStack_1a0 = 0;
    auStack_198 = ZEXT816(0);
    lVar17 = 3;
    auVar25._8_8_ = in_R8;
    auVar25._0_8_ = in_R9;
    auVar26._8_8_ = in_R10;
    auVar26._0_8_ = in_R11;
    pBVar16 = pBVar8;
    lStack_1b0 = lStack_200;
    lStack_1a8 = lStack_1f8;
    do {
      if (lVar17 != 3) {
        iVar14 = 5;
        do {
          point_double((pt_prj_t_conflict1 *)local_228,(pt_prj_t_conflict1 *)local_228);
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      papVar15 = lut_cmb;
      lVar12 = 0;
      do {
        uVar10 = lVar17 + lVar12 * 4;
        if (uVar10 < 0x34) {
          cVar1 = local_188[uVar10];
          cVar2 = cVar1 >> 7;
          auVar23._8_8_ = 0;
          arg3 = *papVar15;
          do {
            bVar18 = (int)((int)(char)(-1 - cVar2) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                          (uint)auVar23._8_8_) < 1;
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      ((uint64_t *)local_2c8,bVar18,(uint64_t *)local_2c8,arg3->X);
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      (auStack_2a0,bVar18,auStack_2a0,arg3->Y);
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      ((uint64_t *)local_278,bVar18,(uint64_t *)local_278,arg3->T);
            auVar23._8_8_ = auVar23._8_8_ + 1;
            arg3 = arg3 + 1;
          } while (auVar23._8_8_ != 0x10);
          pBVar16 = (BIGNUM *)(0xffffffffffffe - local_2a8);
          uVar13 = 0xffffffffffffe - local_258;
          uVar10 = (ulong)cVar2;
          uVar11 = ~uVar10;
          local_2a8 = local_2a8 & uVar11 | uVar10 & (ulong)pBVar16;
          auVar23._0_8_ = 0xffffffffffffe - local_2c8._16_8_;
          auVar23._8_8_ = 0xffffffffffffe - local_2c8._24_8_;
          auVar24._0_8_ = 0x1ffffffffffb2e - local_2c8._0_8_;
          auVar24._8_8_ = 0xffffffffffffe - local_2c8._8_8_;
          auVar19._0_4_ = (uint)cVar2;
          auVar19._4_4_ = 0;
          auVar19._8_4_ = auVar19._0_4_;
          auVar19._12_4_ = 0;
          auVar21._8_4_ = (int)uVar11;
          auVar21._0_8_ = uVar11;
          auVar21._12_4_ = (int)(uVar11 >> 0x20);
          local_2c8._0_16_ = local_2c8._0_16_ & auVar21 | auVar19 & auVar24;
          register0x000012c0 = stack0xfffffffffffffd48 & auVar21 | auVar19 & auVar23;
          local_258 = uVar11 & local_258 | uVar10 & uVar13;
          auVar25._0_8_ = 0xffffffffffffe - local_268._0_8_;
          auVar25._8_8_ = 0xffffffffffffe - local_268._8_8_;
          auVar26._0_8_ = 0x1ffffffffffb2e - local_278._0_8_;
          auVar26._8_8_ = 0xffffffffffffe - local_278._8_8_;
          local_278 = local_278 & auVar21 | auVar19 & auVar26;
          local_268 = auVar21 & local_268 | auVar19 & auVar25;
          point_add_mixed((pt_prj_t_conflict1 *)local_228,(pt_prj_t_conflict1 *)local_228,
                          (pt_aff_t_conflict1 *)local_2c8);
          lStack_300 = auVar24._8_8_;
          local_308 = auVar23._0_8_;
          local_2e0 = auVar24._0_8_;
          local_2d8 = auVar24._8_8_;
        }
        lVar12 = lVar12 + 1;
        papVar15 = (pt_aff_t_conflict1 (*) [16])((long)papVar15 + 0x780);
      } while (lVar12 != 0xe);
      bVar18 = lVar17 != 0;
      lVar17 = lVar17 + -1;
    } while (bVar18);
    local_a8 = local_2e0;
    local_a0 = local_2d8;
    local_98 = local_308;
    local_2c8._8_8_ = 0xffffffffffffe;
    local_2c8._0_8_ = 0x1ffffffffffb21;
    uStack_2b0 = 0xffffffffffffe;
    local_2c8._16_8_ = 0xffffffffffffe;
    local_2a8 = 0xffffffffffffe;
    auStack_2a0[2] = 0x60ec939cfdf1b;
    auStack_2a0[3] = 0x6cd212230e3ea;
    auStack_2a0[0] = 0xb2592dba300e7;
    auStack_2a0[1] = 0x3e87f22e81f92;
    auStack_2a0[4] = 0x30650f195523a;
    local_278._8_8_ = 0xd318b3a36658b;
    local_278._0_8_ = 0x1f178ad8b8e5cf;
    local_268._8_8_ = 0xf955143846d13;
    local_268._0_8_ = 0x93fc81071ab99;
    local_258 = 0x8ade3bb6ad301;
    local_90 = auVar23._8_8_;
    local_88 = pBVar16;
    local_58 = auVar26._0_8_;
    local_50 = auVar26._8_8_;
    local_48 = auVar25._0_8_;
    local_40 = auVar25._8_8_;
    local_38 = uVar13;
    point_add_mixed((pt_prj_t_conflict1 *)local_148,(pt_prj_t_conflict1 *)local_228,
                    (pt_aff_t_conflict1 *)local_2c8);
    auVar25._8_8_ = -(ulong)(local_248[0] & 1);
    auVar23._8_8_ = (ulong)(local_248[0] & 1) - 1;
    auVar20._8_4_ = (int)auVar25._8_8_;
    auVar20._0_8_ = auVar25._8_8_;
    auVar20._12_4_ = (int)((ulong)auVar25._8_8_ >> 0x20);
    auVar22._8_4_ = (int)auVar23._8_8_;
    auVar22._0_8_ = auVar23._8_8_;
    auVar22._12_4_ = (int)((ulong)auVar23._8_8_ >> 0x20);
    local_228 = local_148._0_16_ & auVar22 | local_228 & auVar20;
    local_218 = local_148._16_16_ & auVar22 | local_218 & auVar20;
    auVar3._8_8_ = lStack_200;
    auVar3._0_8_ = local_208;
    auVar23 = local_128 & auVar22 | auVar3 & auVar20;
    local_208 = auVar23._0_8_;
    lStack_200 = auVar23._8_8_;
    auVar4._8_8_ = lStack_1f0;
    auVar4._0_8_ = lStack_1f8;
    auVar23 = local_118 & auVar22 | auVar4 & auVar20;
    lStack_1f8 = auVar23._0_8_;
    lStack_1f0 = auVar23._8_8_;
    auStack_1e8 = local_108 & auVar22 | auStack_1e8 & auVar20;
    local_1d8 = local_f8 & auVar22 | local_1d8 & auVar20;
    local_1c8 = local_e8 & auVar22 | local_1c8 & auVar20;
    auVar5._8_8_ = lStack_1b0;
    auVar5._0_8_ = local_1b8;
    auVar23 = local_d8 & auVar22 | auVar5 & auVar20;
    local_1b8 = auVar23._0_8_;
    lStack_1b0 = auVar23._8_8_;
    auVar6._8_8_ = lStack_1a0;
    auVar6._0_8_ = lStack_1a8;
    auVar23 = local_c8 & auVar22 | auVar6 & auVar20;
    lStack_1a8 = auVar23._0_8_;
    lStack_1a0 = auVar23._8_8_;
    auStack_198 = auVar22 & local_b8 | auVar20 & auStack_198;
    point_edwards2legacy((pt_prj_t_conflict1 *)local_228,(pt_prj_t_conflict1 *)local_228);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(&lStack_1b0,&lStack_1b0);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(&local_a8,(uint64_t *)local_228,&lStack_1b0)
    ;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_80,&lStack_200,&lStack_1b0);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(local_228,&local_a8);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(local_148,local_80);
    iVar14 = CRYPTO_memcmp("",local_228,0x20);
    if ((iVar14 == 0) && (iVar14 = CRYPTO_memcmp("",local_148,0x20), iVar14 == 0)) {
      iVar14 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar14 == 0) {
        iVar14 = 0;
        goto LAB_001348fd;
      }
    }
    else {
      auVar23._8_8_ = BN_lebin2bn(local_228,0x20,pBVar8);
      iVar14 = 0;
      if ((auVar23._8_8_ == 0) ||
         ((auVar23._8_8_ = BN_lebin2bn(local_148,0x20,pBVar9), iVar14 = 0, auVar23._8_8_ == 0 ||
          (iVar7 = EC_POINT_set_affine_coordinates(group,r,pBVar8,pBVar9,ctx), iVar7 == 0))))
      goto LAB_001348fd;
    }
    iVar14 = 1;
  }
LAB_001348fd:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar14;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_256_paramSetA(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 32) != 32)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}